

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

Var BranchBailOutRecord::BailOutInlined
              (JavascriptCallStackLayout *layout,BranchBailOutRecord *bailOutRecord,BOOL cond,
              void *returnAddress,ImplicitCallFlags savedImplicitCallFlags)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint32 *puVar4;
  Var pvVar5;
  
  if ((bailOutRecord->super_BailOutRecord).parent == (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0xb7f,"(bailOutRecord->parent != nullptr)",
                       "bailOutRecord->parent != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  puVar4 = &(bailOutRecord->super_BailOutRecord).bailOutOffset;
  if (cond == 0) {
    puVar4 = &bailOutRecord->falseBailOutOffset;
  }
  if ((bailOutRecord->super_BailOutRecord).branchValueRegSlot == 0xffffffff) {
    pvVar5 = (Var)0x0;
  }
  else {
    pvVar5 = *(Var *)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)layout + 8) + 8) + 0x490) + 8
                               ) + 1000 + (ulong)(cond == 0) * 8);
  }
  pvVar5 = BailOutRecord::BailOutInlinedCommon
                     (layout,&bailOutRecord->super_BailOutRecord,*puVar4,returnAddress,
                      (bailOutRecord->super_BailOutRecord).bailOutKind,savedImplicitCallFlags,pvVar5
                     );
  return pvVar5;
}

Assistant:

Js::Var
BranchBailOutRecord::BailOutInlined(Js::JavascriptCallStackLayout * layout, BranchBailOutRecord const * bailOutRecord, BOOL cond, void * returnAddress, Js::ImplicitCallFlags savedImplicitCallFlags)
{
    Assert(bailOutRecord->parent != nullptr);
    uint32 bailOutOffset = cond? bailOutRecord->bailOutOffset : bailOutRecord->falseBailOutOffset;
    Js::Var branchValue = nullptr;
    if (bailOutRecord->branchValueRegSlot != Js::Constants::NoRegister)
    {
        Js::ScriptContext *scriptContext = layout->functionObject->GetScriptContext();
        branchValue = (cond ? scriptContext->GetLibrary()->GetTrue() : scriptContext->GetLibrary()->GetFalse());
    }
    return __super::BailOutInlinedCommon(layout, bailOutRecord, bailOutOffset, returnAddress, bailOutRecord->bailOutKind, savedImplicitCallFlags, branchValue);
}